

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arguments.cc
# Opt level: O0

void __thiscall phosg::Arguments::assert_none_unused(Arguments *this)

{
  value_type *pvVar1;
  bool bVar2;
  value_type *pvVar3;
  invalid_argument *piVar4;
  reference this_00;
  char *pcVar5;
  string local_b8;
  reference local_98;
  ArgText *instance_it;
  const_iterator __end2;
  const_iterator __begin2;
  vector<phosg::Arguments::ArgText,_std::allocator<phosg::Arguments::ArgText>_> *__range2;
  size_t index;
  value_type *named_it;
  const_iterator __end1;
  const_iterator __begin1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<phosg::Arguments::ArgText,_std::allocator<phosg::Arguments::ArgText>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<phosg::Arguments::ArgText,_std::allocator<phosg::Arguments::ArgText>_>_>_>_>
  *__range1;
  string local_40;
  const_reference local_20;
  value_type *arg;
  size_t z;
  Arguments *this_local;
  
  arg = (value_type *)0x0;
  z = (size_t)this;
  while( true ) {
    pvVar1 = arg;
    pvVar3 = (value_type *)
             ::std::vector<phosg::Arguments::ArgText,_std::allocator<phosg::Arguments::ArgText>_>::
             size(&this->positional);
    if (pvVar3 <= pvVar1) {
      __end1 = ::std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<phosg::Arguments::ArgText,_std::allocator<phosg::Arguments::ArgText>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<phosg::Arguments::ArgText,_std::allocator<phosg::Arguments::ArgText>_>_>_>_>
               ::begin(&this->named);
      named_it = (value_type *)
                 ::std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<phosg::Arguments::ArgText,_std::allocator<phosg::Arguments::ArgText>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<phosg::Arguments::ArgText,_std::allocator<phosg::Arguments::ArgText>_>_>_>_>
                 ::end(&this->named);
      do {
        bVar2 = ::std::__detail::operator==
                          (&__end1.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<phosg::Arguments::ArgText,_std::allocator<phosg::Arguments::ArgText>_>_>,_true>
                           ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<phosg::Arguments::ArgText,_std::allocator<phosg::Arguments::ArgText>_>_>,_true>
                             *)&named_it);
        if (((bVar2 ^ 0xffU) & 1) == 0) {
          return;
        }
        this_00 = ::std::__detail::
                  _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<phosg::Arguments::ArgText,_std::allocator<phosg::Arguments::ArgText>_>_>,_false,_true>
                  ::operator*(&__end1);
        __range2 = (vector<phosg::Arguments::ArgText,_std::allocator<phosg::Arguments::ArgText>_> *)
                   0x0;
        __end2 = ::std::
                 vector<phosg::Arguments::ArgText,_std::allocator<phosg::Arguments::ArgText>_>::
                 begin(&this_00->second);
        instance_it = (ArgText *)
                      ::std::
                      vector<phosg::Arguments::ArgText,_std::allocator<phosg::Arguments::ArgText>_>
                      ::end(&this_00->second);
        while( true ) {
          bVar2 = __gnu_cxx::
                  operator==<const_phosg::Arguments::ArgText_*,_std::vector<phosg::Arguments::ArgText,_std::allocator<phosg::Arguments::ArgText>_>_>
                            (&__end2,(__normal_iterator<const_phosg::Arguments::ArgText_*,_std::vector<phosg::Arguments::ArgText,_std::allocator<phosg::Arguments::ArgText>_>_>
                                      *)&instance_it);
          if (((bVar2 ^ 0xffU) & 1) == 0) break;
          local_98 = __gnu_cxx::
                     __normal_iterator<const_phosg::Arguments::ArgText_*,_std::vector<phosg::Arguments::ArgText,_std::allocator<phosg::Arguments::ArgText>_>_>
                     ::operator*(&__end2);
          if ((local_98->used & 1U) == 0) {
            piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
            pcVar5 = ::std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                               (&this_00->first);
            string_printf_abi_cxx11_(&local_b8,"(--%s#%zu) excess argument",pcVar5,__range2);
            ::std::invalid_argument::invalid_argument(piVar4,(string *)&local_b8);
            __cxa_throw(piVar4,&::std::invalid_argument::typeinfo,
                        ::std::invalid_argument::~invalid_argument);
          }
          __range2 = (vector<phosg::Arguments::ArgText,_std::allocator<phosg::Arguments::ArgText>_>
                      *)((long)&(__range2->
                                super__Vector_base<phosg::Arguments::ArgText,_std::allocator<phosg::Arguments::ArgText>_>
                                )._M_impl.super__Vector_impl_data._M_start + 1);
          __gnu_cxx::
          __normal_iterator<const_phosg::Arguments::ArgText_*,_std::vector<phosg::Arguments::ArgText,_std::allocator<phosg::Arguments::ArgText>_>_>
          ::operator++(&__end2);
        }
        ::std::__detail::
        _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<phosg::Arguments::ArgText,_std::allocator<phosg::Arguments::ArgText>_>_>,_false,_true>
        ::operator++(&__end1);
      } while( true );
    }
    local_20 = ::std::vector<phosg::Arguments::ArgText,_std::allocator<phosg::Arguments::ArgText>_>
               ::operator[](&this->positional,(size_type)arg);
    if ((local_20->used & 1U) == 0) break;
    arg = (value_type *)((long)&(arg->text)._M_dataplus._M_p + 1);
  }
  piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
  string_printf_abi_cxx11_(&local_40,"(@%zu) excess argument",arg);
  ::std::invalid_argument::invalid_argument(piVar4,(string *)&local_40);
  __cxa_throw(piVar4,&::std::invalid_argument::typeinfo,::std::invalid_argument::~invalid_argument);
}

Assistant:

void Arguments::assert_none_unused() const {
  for (size_t z = 0; z < this->positional.size(); z++) {
    const auto& arg = this->positional[z];
    if (!arg.used) {
      throw invalid_argument(string_printf("(@%zu) excess argument", z));
    }
  }
  for (const auto& named_it : this->named) {
    size_t index = 0;
    for (const auto& instance_it : named_it.second) {
      if (!instance_it.used) {
        throw invalid_argument(string_printf("(--%s#%zu) excess argument", named_it.first.c_str(), index));
      }
      index++;
    }
  }
}